

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

ModuleData ** __thiscall
SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::find
          (SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U> *this,InplaceStr *key)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Node *this_00;
  InplaceStr local_48;
  
  uVar1 = this->bucketCount;
  uVar3 = NULLC::GetStringHash(key->begin,key->end);
  if (this->bucketCount != 0) {
    uVar4 = 0;
    do {
      uVar3 = uVar3 & uVar1 - 1;
      this_00 = this->data + uVar3;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      bVar2 = InplaceStr::operator==(&this_00->key,&local_48);
      if (bVar2) {
        return (ModuleData **)0x0;
      }
      bVar2 = InplaceStr::operator==(&this_00->key,key);
      if (bVar2) {
        return &this_00->value;
      }
      uVar3 = uVar3 + uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->bucketCount);
  }
  return (ModuleData **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}